

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O1

idx_t duckdb::FindStrInStr(uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size)

{
  byte bVar1;
  short sVar2;
  long lVar3;
  int iVar4;
  uchar *haystack_00;
  uchar *puVar5;
  idx_t iVar6;
  short *psVar7;
  int *piVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *base_offset;
  bool bVar12;
  uchar *local_40;
  
  haystack_00 = (uchar *)memchr(haystack,(uint)*needle,haystack_size);
  puVar5 = (uchar *)0xffffffffffffffff;
  if (haystack_00 != (uchar *)0x0) {
    base_offset = haystack_00 + -(long)haystack;
    uVar10 = haystack_size - (long)base_offset;
    switch(needle_size) {
    case 1:
      puVar5 = base_offset;
      break;
    case 2:
      if ((1 < uVar10) && (uVar10 = uVar10 - 1, uVar10 != 0)) {
        sVar2 = *(short *)needle;
        bVar1 = *needle;
        uVar11 = 0;
        do {
          psVar7 = (short *)memchr(haystack_00 + uVar11,(uint)bVar1,uVar10 - uVar11);
          if (psVar7 == (short *)0x0) {
            bVar12 = false;
            needle = (uchar *)0xffffffffffffffff;
          }
          else {
            uVar11 = (long)psVar7 - (long)haystack_00;
            bVar12 = sVar2 != *psVar7;
            if (!bVar12) {
              needle = base_offset + uVar11;
            }
          }
          if (!bVar12) {
            return (idx_t)needle;
          }
          uVar11 = uVar11 + 1;
          puVar5 = (uchar *)0xffffffffffffffff;
        } while (uVar11 < uVar10);
      }
      break;
    case 3:
      if ((2 < uVar10) && (uVar10 = uVar10 - 2, uVar10 != 0)) {
        sVar2 = *(short *)needle;
        bVar1 = *needle;
        uVar11 = 0;
        do {
          psVar7 = (short *)memchr(haystack_00 + uVar11,(uint)bVar1,uVar10 - uVar11);
          if (psVar7 == (short *)0x0) {
            bVar12 = false;
            needle_size = (idx_t)(uchar *)0xffffffffffffffff;
          }
          else {
            uVar11 = (long)psVar7 - (long)haystack_00;
            bVar12 = true;
            if (sVar2 == *psVar7) {
              bVar12 = (uchar)psVar7[1] != needle[2];
              if (!bVar12) {
                needle_size = (idx_t)(base_offset + uVar11);
              }
            }
          }
          if (!bVar12) {
            return (idx_t)(uchar *)needle_size;
          }
          uVar11 = uVar11 + 1;
          puVar5 = (uchar *)0xffffffffffffffff;
        } while (uVar11 < uVar10);
      }
      break;
    case 4:
      if ((3 < uVar10) && (uVar10 = uVar10 - 3, uVar10 != 0)) {
        iVar4 = *(int *)needle;
        bVar1 = *needle;
        uVar11 = 0;
        do {
          piVar8 = (int *)memchr(haystack_00 + uVar11,(uint)bVar1,uVar10 - uVar11);
          if (piVar8 == (int *)0x0) {
            bVar12 = false;
            needle = (uchar *)0xffffffffffffffff;
          }
          else {
            uVar11 = (long)piVar8 - (long)haystack_00;
            bVar12 = iVar4 != *piVar8;
            if (!bVar12) {
              needle = base_offset + uVar11;
            }
          }
          if (!bVar12) {
            return (idx_t)needle;
          }
          uVar11 = uVar11 + 1;
          puVar5 = (uchar *)0xffffffffffffffff;
        } while (uVar11 < uVar10);
      }
      break;
    case 5:
    case 6:
    case 7:
      iVar6 = Contains<unsigned_int,duckdb::ContainsUnaligned>
                        (haystack_00,uVar10,needle,needle_size,(idx_t)base_offset);
      return iVar6;
    case 8:
      if ((7 < uVar10) && (uVar10 = uVar10 - 7, uVar10 != 0)) {
        lVar3 = *(long *)needle;
        bVar1 = *needle;
        uVar11 = 0;
        do {
          plVar9 = (long *)memchr(haystack_00 + uVar11,(uint)bVar1,uVar10 - uVar11);
          if (plVar9 == (long *)0x0) {
            bVar12 = false;
            needle = (uchar *)0xffffffffffffffff;
          }
          else {
            uVar11 = (long)plVar9 - (long)haystack_00;
            bVar12 = lVar3 != *plVar9;
            if (!bVar12) {
              needle = base_offset + uVar11;
            }
          }
          if (!bVar12) {
            return (idx_t)needle;
          }
          uVar11 = uVar11 + 1;
          puVar5 = (uchar *)0xffffffffffffffff;
        } while (uVar11 < uVar10);
      }
      break;
    default:
      if ((needle_size <= uVar10) && (uVar10 = (uVar10 + 1) - needle_size, uVar10 != 0)) {
        lVar3 = *(long *)needle;
        bVar1 = *needle;
        uVar11 = 0;
        do {
          plVar9 = (long *)memchr(haystack_00 + uVar11,(uint)bVar1,uVar10 - uVar11);
          if (plVar9 == (long *)0x0) {
            local_40 = (uchar *)0xffffffffffffffff;
            bVar12 = false;
          }
          else {
            uVar11 = (long)plVar9 - (long)haystack_00;
            bVar12 = true;
            if (lVar3 == *plVar9) {
              iVar4 = bcmp(plVar9 + 1,needle + 8,needle_size - 8);
              bVar12 = iVar4 != 0;
              if (!bVar12) {
                local_40 = base_offset + uVar11;
              }
            }
          }
          if (!bVar12) {
            return (idx_t)local_40;
          }
          uVar11 = uVar11 + 1;
          puVar5 = (uchar *)0xffffffffffffffff;
        } while (uVar11 < uVar10);
      }
    }
  }
  return (idx_t)puVar5;
}

Assistant:

idx_t FindStrInStr(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle, idx_t needle_size) {
	D_ASSERT(needle_size > 0);
	// start off by performing a memchr to find the first character of the
	auto location = memchr(haystack, needle[0], haystack_size);
	if (location == nullptr) {
		return DConstants::INVALID_INDEX;
	}
	idx_t base_offset = UnsafeNumericCast<idx_t>(const_uchar_ptr_cast(location) - haystack);
	haystack_size -= base_offset;
	haystack = const_uchar_ptr_cast(location);
	// switch algorithm depending on needle size
	switch (needle_size) {
	case 1:
		return base_offset;
	case 2:
		return Contains<uint16_t, ContainsAligned>(haystack, haystack_size, needle, 2, base_offset);
	case 3:
		return Contains<uint16_t, ContainsUnaligned>(haystack, haystack_size, needle, 3, base_offset);
	case 4:
		return Contains<uint32_t, ContainsAligned>(haystack, haystack_size, needle, 4, base_offset);
	case 5:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 5, base_offset);
	case 6:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 6, base_offset);
	case 7:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 7, base_offset);
	case 8:
		return Contains<uint64_t, ContainsAligned>(haystack, haystack_size, needle, 8, base_offset);
	default:
		return Contains<uint64_t, ContainsGeneric>(haystack, haystack_size, needle, needle_size, base_offset);
	}
}